

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.cpp
# Opt level: O3

void __thiscall OS_CoreSocket::~OS_CoreSocket(OS_CoreSocket *this)

{
  ~OS_CoreSocket((OS_CoreSocket *)&this[-1].blocked_evt);
  operator_delete(&this[-1].blocked_evt,0x40);
  return;
}

Assistant:

OS_CoreSocket::~OS_CoreSocket()
{
    /* close the socket */
    close();

    /* release resources */
    if (ready_evt != 0)
        ready_evt->release_ref();
    if (blocked_evt != 0)
        blocked_evt->release_ref();
    if (mon_thread != 0)
        mon_thread->release_ref();
}